

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t zeGetEventExpProcAddrTable(ze_api_version_t version,ze_event_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_result_t zVar3;
  code *pcVar4;
  iterator __begin1;
  undefined8 *puVar5;
  ze_event_exp_dditable_t dditable;
  ze_pfnEventQueryTimestampsExp_t local_38;
  
  puVar5 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar5) {
LAB_001af0ca:
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_event_exp_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    zVar3 = ZE_RESULT_SUCCESS;
    for (; puVar5 != puVar1; puVar5 = puVar5 + 0x1b3) {
      if ((*(int *)(puVar5 + 1) == 0) &&
         (pcVar4 = (code *)dlsym(*puVar5,"zeGetEventExpProcAddrTable"), pcVar4 != (code *)0x0)) {
        zVar3 = (*pcVar4)(version,puVar5 + 0xa1);
      }
    }
    if (zVar3 == ZE_RESULT_SUCCESS) {
      pcVar4 = loader::zeEventQueryTimestampsExp;
      if (((ulong)((*(long *)(loader::context + 0x15e8) - *(long *)(loader::context + 0x15e0) >> 3)
                  * 0x7aff6957aff6957b) < 2) && (*(char *)(loader::context + 0x1629) == '\0')) {
        pcVar4 = *(code **)(*(long *)(loader::context + 0x15e0) + 0x508);
      }
      pDdiTable->pfnQueryTimestampsExp = pcVar4;
      if (*(long *)(loader::context + 0x1618) == 0) {
        zVar3 = ZE_RESULT_SUCCESS;
      }
      else {
        pcVar4 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetEventExpProcAddrTable");
        if (pcVar4 == (code *)0x0) goto LAB_001af0ca;
        zVar3 = (*pcVar4)(version,pDdiTable);
      }
    }
    if (zVar3 == ZE_RESULT_SUCCESS) {
      if (*(long *)(loader::context + 0x1620) == 0) {
        zVar3 = ZE_RESULT_SUCCESS;
      }
      else {
        pcVar4 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetEventExpProcAddrTable");
        zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (pcVar4 != (code *)0x0) {
          local_38 = pDdiTable->pfnQueryTimestampsExp;
          zVar3 = (*pcVar4)(version,&local_38);
          lVar2 = loader::context;
          *(ze_pfnEventQueryTimestampsExp_t *)(loader::context + 0x1b50) = local_38;
          if (*(char *)(lVar2 + 0x1652) == '\x01') {
            zVar3 = (*pcVar4)(version,pDdiTable);
          }
        }
      }
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetEventExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_event_exp_dditable_t* pDdiTable              ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetEventExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.EventExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnQueryTimestampsExp                       = loader::zeEventQueryTimestampsExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.EventExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetEventExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetEventExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_event_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_event_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.EventExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}